

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

void kratos::set_var_params
               (Var *var,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
               *parameters)

{
  _Rb_tree_header *p_Var1;
  Var *pVVar2;
  ulong uVar3;
  __node_base_ptr p_Var4;
  _Hash_node_base *p_Var5;
  int iVar6;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar7;
  _Base_ptr p_Var8;
  __node_base_ptr p_Var9;
  mapped_type *ppVVar10;
  undefined8 extraout_RAX_01;
  _Rb_tree_node_base *p_Var11;
  ulong uVar12;
  const_iterator __begin3;
  __node_base_ptr p_Var13;
  uint32_t index;
  ulong uVar14;
  const_iterator cVar15;
  mapped_type expr;
  bool bVar16;
  undefined1 local_80 [32];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
  *__range3;
  undefined1 local_58 [32];
  const_iterator __end3;
  
  pVVar2 = var->width_param_;
  local_80._24_8_ = parameters;
  __end3._M_node = (_Base_ptr)var;
  if (pVVar2 != (Var *)0x0) {
    p_Var8 = (parameters->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(parameters->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var8 != p_Var1) {
      local_58._24_8_ = local_58._24_8_ & 0xffffffff00000000;
      do {
        iVar6 = (*(pVVar2->super_IRNode)._vptr_IRNode[0x1b])(pVVar2);
        if ((char)iVar6 == '\0') {
          bVar16 = false;
        }
        else {
          Var::as<kratos::Param>((Var *)local_80);
          bVar16 = *(_func_int **)(local_80._0_8_ + 0x368) == *(_func_int **)(p_Var8 + 2);
          if ((pointer)local_80._8_8_ != (pointer)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
          }
        }
        if (bVar16) {
          local_58._0_8_ = pVVar2;
          std::
          _Hashtable<kratos::Var_*,_kratos::Var_*,_std::allocator<kratos::Var_*>,_std::__detail::_Identity,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::_M_erase((_Hashtable<kratos::Var_*,_kratos::Var_*,_std::allocator<kratos::Var_*>,_std::__detail::_Identity,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)(*(long *)(p_Var8 + 2) + 0x2c8),local_58);
          local_58._0_8_ = *(undefined8 *)(p_Var8 + 2);
          local_58._8_8_ = p_Var8[2]._M_parent;
          if ((_Base_ptr)local_58._8_8_ != (_Base_ptr)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&((_Base_ptr)local_58._8_8_)->_M_parent =
                   *(int *)&((_Base_ptr)local_58._8_8_)->_M_parent + 1;
              UNLOCK();
            }
            else {
              *(int *)&((_Base_ptr)local_58._8_8_)->_M_parent =
                   *(int *)&((_Base_ptr)local_58._8_8_)->_M_parent + 1;
            }
          }
          Var::set_width_param((Var *)__end3._M_node,(shared_ptr<kratos::Var> *)local_58);
          uVar7 = extraout_RAX;
          if ((_Base_ptr)local_58._8_8_ != (_Base_ptr)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
            uVar7 = extraout_RAX_00;
          }
          local_58._24_4_ = (int)CONCAT71((int7)((ulong)uVar7 >> 8),1);
        }
      } while ((!bVar16) &&
              (p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8),
              (_Rb_tree_header *)p_Var8 != p_Var1));
      parameters = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
                    *)local_80._24_8_;
      if ((local_58._24_8_ & 1) != 0) goto LAB_00168dc5;
    }
    parameters = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
                  *)local_80._24_8_;
    (**(code **)(*(long *)__end3._M_node + 0x118))(__end3._M_node,0);
  }
LAB_00168dc5:
  if (__end3._M_node[5]._M_parent != *(_Base_ptr *)(__end3._M_node + 5)) {
    local_80._16_8_ = &__end3._M_node[5]._M_right;
    local_58._24_8_ = &(((_Rep_type *)&((pointer)parameters)->first)->_M_impl).super__Rb_tree_header
    ;
    uVar14 = 0;
    cVar15._M_node = __end3._M_node;
    do {
      index = (uint32_t)uVar14;
      uVar3 = (((Var *)cVar15._M_node)->size_param_)._M_h._M_bucket_count;
      uVar12 = (uVar14 & 0xffffffff) % uVar3;
      p_Var4 = (((Var *)cVar15._M_node)->size_param_)._M_h._M_buckets[uVar12];
      p_Var9 = (__node_base_ptr)0x0;
      if ((p_Var4 != (__node_base_ptr)0x0) &&
         (p_Var9 = p_Var4, p_Var13 = p_Var4->_M_nxt, *(uint32_t *)&p_Var4->_M_nxt[1]._M_nxt != index
         )) {
        while (p_Var5 = p_Var13->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
          p_Var9 = (__node_base_ptr)0x0;
          if (((ulong)*(uint *)&p_Var5[1]._M_nxt % uVar3 != uVar12) ||
             (p_Var9 = p_Var13, p_Var13 = p_Var5, *(uint *)&p_Var5[1]._M_nxt == index))
          goto LAB_00168e57;
        }
        p_Var9 = (__node_base_ptr)0x0;
      }
LAB_00168e57:
      __range3._4_4_ = index;
      if ((p_Var9 == (__node_base_ptr)0x0) || (p_Var9->_M_nxt == (_Hash_node_base *)0x0)) {
        expr = (Var *)0x0;
      }
      else {
        ppVVar10 = std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_kratos::Var_*>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_kratos::Var_*>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)local_80._16_8_,(key_type *)((long)&__range3 + 4));
        expr = *ppVVar10;
      }
      p_Var11 = (((_Rep_type *)&((pointer)parameters)->first)->_M_impl).super__Rb_tree_header.
                _M_header._M_left;
      if (p_Var11 == (_Rb_tree_node_base *)local_58._24_8_ || expr == (Var *)0x0) {
LAB_00168f38:
        Var::set_size_param((Var *)cVar15._M_node,index,(Var *)0x0);
      }
      else {
        local_58._20_4_ = 0;
        do {
          iVar6 = (*(expr->super_IRNode)._vptr_IRNode[0x1b])(expr);
          if ((char)iVar6 == '\0') {
            bVar16 = false;
          }
          else {
            Var::as<kratos::Param>((Var *)local_58);
            bVar16 = *(long *)(local_58._0_8_ + 0x368) == *(long *)(p_Var11 + 2);
            if ((_Base_ptr)local_58._8_8_ != (_Base_ptr)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
            }
          }
          cVar15._M_node = __end3._M_node;
          if (bVar16) {
            Param::remove_param_size_var(*(Param **)(p_Var11 + 2),(Var *)__end3._M_node,index,expr);
            Var::set_size_param((Var *)cVar15._M_node,index,*(Var **)(p_Var11 + 2));
            local_58._20_4_ = (undefined4)CONCAT71((int7)((ulong)extraout_RAX_01 >> 8),1);
            break;
          }
          p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
        } while (p_Var11 != (_Rb_tree_node_base *)local_58._24_8_);
        parameters = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Param>_>_>_>
                      *)local_80._24_8_;
        cVar15._M_node = __end3._M_node;
        if ((local_58._20_4_ & 1) == 0) goto LAB_00168f38;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < (ulong)((long)(((Var *)cVar15._M_node)->size_).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)(((Var *)cVar15._M_node)->size_).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  return;
}

Assistant:

void set_var_params(Var *var, const std::map<std::string, std::shared_ptr<Param>> &parameters) {
    auto *param = var->width_param();
    if (param) {
        // brute force
        bool found = false;
        for (auto const &iter : parameters) {
            auto const &parent_param = iter.second;
            // for now, we only support exact match
            if (param->is_param() && param->as<Param>()->parent_param() == parent_param.get()) {
                // found it
                parent_param->remove_param_width_var(param);
                var->set_width_param(parent_param);
                found = true;
                break;
            }
        }
        if (!found) {
            var->set_width_param(nullptr);
        }
    }

    // size param as well
    for (uint64_t i = 0; i < var->size().size(); i++) {
        param = var->get_size_param(i);
        if (param) {
            // brute force
            bool found = false;
            for (auto const &iter : parameters) {
                auto const &parent_param = iter.second;
                // for now, we only support exact match
                if (param->is_param() && param->as<Param>()->parent_param() == parent_param.get()) {
                    // found it
                    parent_param->remove_param_size_var(var, i, param);
                    var->set_size_param(i, parent_param.get());
                    found = true;
                    break;
                }
            }
            if (!found) {
                var->set_size_param(i, nullptr);
            }
        } else {
            var->set_size_param(i, nullptr);
        }
    }
}